

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamCoreRandom.hpp
# Opt level: O0

void TasDREAM::applyUniformUpdate
               (vector<double,_std::allocator<double>_> *x,double magnitude,
               function<double_()> *get_random01)

{
  bool bVar1;
  reference pdVar2;
  double dVar3;
  double *v;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  function<double_()> *get_random01_local;
  double magnitude_local;
  vector<double,_std::allocator<double>_> *x_local;
  
  if ((magnitude != 0.0) || (NAN(magnitude))) {
    __end1 = std::vector<double,_std::allocator<double>_>::begin(x);
    v = (double *)std::vector<double,_std::allocator<double>_>::end(x);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                       *)&v), bVar1) {
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&__end1);
      dVar3 = std::function<double_()>::operator()(get_random01);
      *pdVar2 = magnitude * (dVar3 + dVar3 + -1.0) + *pdVar2;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end1);
    }
  }
  return;
}

Assistant:

inline void applyUniformUpdate(std::vector<double> &x, double magnitude, std::function<double(void)> get_random01 = tsgCoreUniform01){
    if (magnitude == 0.0) return;
    for(auto &v : x) v += magnitude * (2.0 * get_random01() -1.0);
}